

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O1

bool __thiscall wallet::CWalletTx::IsEquivalentTo(CWalletTx *this,CWalletTx *_tx)

{
  pointer pCVar1;
  CTxIn *txin;
  long in_FS_OFFSET;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  CMutableTransaction tx2;
  CMutableTransaction tx1;
  CMutableTransaction local_190;
  CMutableTransaction local_158;
  CTransaction local_120;
  CTransaction local_a0;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction
            (&local_158,
             (this->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  CMutableTransaction::CMutableTransaction
            (&local_190,
             (_tx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  for (; pCVar1 = local_190.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start,
      local_158.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_158.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish;
      local_158.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_158.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start + 1) {
    if (0x1c < ((local_158.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._size) {
      free(((local_158.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union.
           indirect_contents.indirect);
    }
    *(undefined1 (*) [16])
     ((long)&((local_158.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union + 0x10) =
         (undefined1  [16])0x0;
    *(undefined1 (*) [16])
     &((local_158.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union =
         (undefined1  [16])0x0;
  }
  for (; pCVar1 != local_190.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish; pCVar1 = pCVar1 + 1) {
    if (0x1c < (pCVar1->scriptSig).super_CScriptBase._size) {
      free((pCVar1->scriptSig).super_CScriptBase._union.indirect_contents.indirect);
    }
    *(undefined1 (*) [16])((long)&(pCVar1->scriptSig).super_CScriptBase._union + 0x10) =
         (undefined1  [16])0x0;
    *(undefined1 (*) [16])&(pCVar1->scriptSig).super_CScriptBase._union = (undefined1  [16])0x0;
  }
  CTransaction::CTransaction(&local_a0,&local_158);
  CTransaction::CTransaction(&local_120,&local_190);
  auVar3[0] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
  auVar3[1] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
  auVar3[2] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
  auVar3[3] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
  auVar3[4] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
  auVar3[5] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
  auVar3[6] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
  auVar3[7] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
  auVar3[8] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
  auVar3[9] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
  auVar3[10] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
  auVar3[0xb] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                 local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar3[0xc] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                 local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar3[0xd] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                 local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar3[0xe] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                 local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar3[0xf] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                 local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar2[0] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar2[1] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar2[2] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar2[3] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar2[4] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar2[5] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar2[6] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar2[7] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar2[8] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar2[9] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
               local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar2[10] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar2[0xb] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                 local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar2[0xc] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                 local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar2[0xd] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                 local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar2[0xe] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                 local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar2[0xf] = -(local_120.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                 local_a0.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar2 = auVar2 & auVar3;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_120.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_120.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_a0.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_a0.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_190.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_190.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_158.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_158.vin);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return (ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar2[0xf] >> 7) << 0xf) == 0xffff;
}

Assistant:

bool CWalletTx::IsEquivalentTo(const CWalletTx& _tx) const
{
        CMutableTransaction tx1 {*this->tx};
        CMutableTransaction tx2 {*_tx.tx};
        for (auto& txin : tx1.vin) txin.scriptSig = CScript();
        for (auto& txin : tx2.vin) txin.scriptSig = CScript();
        return CTransaction(tx1) == CTransaction(tx2);
}